

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createDeviceWithUnsupportedExtensionsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkInstance instance_00;
  RefData<vk::VkInstance_s_*> data;
  VkAllocationCallbacks *platformInterface_00;
  deBool dVar1;
  TestContext *pTVar2;
  TestLog *this;
  VkInstance_s **ppVVar3;
  CommandLine *cmdLine;
  VkPhysicalDevice physicalDevice_00;
  MessageBuilder *pMVar4;
  TestError *this_00;
  allocator<char> local_ac1;
  string local_ac0;
  undefined4 local_aa0;
  allocator<char> local_a99;
  string local_a98;
  undefined1 local_a78 [8];
  DeviceDriver deviceIface;
  bool gotDevice;
  VkDevice pVStack_5b8;
  VkResult result;
  VkDevice device;
  int local_42c;
  undefined1 local_428 [4];
  int ndx;
  undefined1 local_2a8 [8];
  VkDeviceCreateInfo deviceCreateInfo;
  VkDeviceQueueCreateInfo deviceQueueCreateInfo;
  float queuePriority;
  VkPhysicalDevice physicalDevice;
  char *enabledExtensions [3];
  undefined1 local_208 [8];
  InstanceDriver instanceDriver;
  Move<vk::VkInstance_s_*> local_70;
  RefData<vk::VkInstance_s_*> local_58;
  undefined1 local_40 [8];
  Unique<vk::VkInstance_s_*> instance;
  PlatformInterface *platformInterface;
  TestLog *log;
  Context *context_local;
  
  pTVar2 = Context::getTestContext(context);
  this = tcu::TestContext::getLog(pTVar2);
  instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getPlatformInterface(context);
  ::vk::createDefaultInstance
            (&local_70,
             (PlatformInterface *)
             instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_70);
  data.deleter.m_destroyInstance = local_58.deleter.m_destroyInstance;
  data.object = local_58.object;
  data.deleter.m_allocator = local_58.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique((Unique<vk::VkInstance_s_*> *)local_40,data);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_70);
  platformInterface_00 = instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator;
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::get
                      ((RefBase<vk::VkInstance_s_*> *)local_40);
  ::vk::InstanceDriver::InstanceDriver
            ((InstanceDriver *)local_208,(PlatformInterface *)platformInterface_00,*ppVVar3);
  enabledExtensions[1] = "VK_DONT_SUPPORT_ME";
  physicalDevice = (VkPhysicalDevice)anon_var_dwarf_1496be;
  enabledExtensions[0] = "THIS_IS_NOT_AN_EXTENSION";
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::get
                      ((RefBase<vk::VkInstance_s_*> *)local_40);
  instance_00 = *ppVVar3;
  pTVar2 = Context::getTestContext(context);
  cmdLine = tcu::TestContext::getCommandLine(pTVar2);
  physicalDevice_00 = ::vk::chooseDevice((InstanceInterface *)local_208,instance_00,cmdLine);
  deviceQueueCreateInfo.pQueuePriorities._4_4_ = 0x3f800000;
  deviceCreateInfo.pEnabledFeatures._0_4_ = 2;
  deviceQueueCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  deviceQueueCreateInfo._4_4_ = 0;
  deviceQueueCreateInfo.pNext._0_4_ = 0;
  deviceQueueCreateInfo.pNext._4_4_ = 0;
  deviceQueueCreateInfo.flags = 1;
  deviceQueueCreateInfo._24_8_ = (long)&deviceQueueCreateInfo.pQueuePriorities + 4;
  local_2a8._0_4_ = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  deviceCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  deviceCreateInfo._4_4_ = 0;
  deviceCreateInfo.pNext._0_4_ = 0;
  deviceCreateInfo.pNext._4_4_ = 1;
  deviceCreateInfo._16_8_ = &deviceCreateInfo.pEnabledFeatures;
  deviceCreateInfo.pQueueCreateInfos._0_4_ = 0;
  deviceCreateInfo.enabledLayerCount = 0;
  deviceCreateInfo._36_4_ = 0;
  deviceCreateInfo.ppEnabledLayerNames._0_4_ = 3;
  deviceCreateInfo._48_8_ = &physicalDevice;
  deviceCreateInfo.ppEnabledExtensionNames = (char **)0x0;
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_428,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_428,(char (*) [25])"Enabled extensions are: ");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_428);
  for (local_42c = 0; local_42c < 3; local_42c = local_42c + 1) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)&device,this,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&device,enabledExtensions + (long)local_42c + -1);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&device);
  }
  pVStack_5b8 = (VkDevice)0x0;
  deviceIface.m_vk.getPastPresentationTimingGOOGLE._4_4_ =
       ::vk::InstanceDriver::createDevice
                 ((InstanceDriver *)local_208,physicalDevice_00,(VkDeviceCreateInfo *)local_2a8,
                  (VkAllocationCallbacks *)0x0,&stack0xfffffffffffffa48);
  deviceIface.m_vk.getPastPresentationTimingGOOGLE._3_1_ = pVStack_5b8 != (VkDevice)0x0;
  if (pVStack_5b8 != (VkDevice)0x0) {
    ::vk::DeviceDriver::DeviceDriver
              ((DeviceDriver *)local_a78,(InstanceInterface *)local_208,pVStack_5b8);
    ::vk::DeviceDriver::destroyDevice
              ((DeviceDriver *)local_a78,pVStack_5b8,(VkAllocationCallbacks *)0x0);
    ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)local_a78);
  }
  if (deviceIface.m_vk.getPastPresentationTimingGOOGLE._4_4_ == VK_ERROR_EXTENSION_NOT_PRESENT) {
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || ((deviceIface.m_vk.getPastPresentationTimingGOOGLE._3_1_ & 1) != 0)) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"!gotDevice",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                   ,0x216);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a98,"Pass, create device with unsupported extension is rejected.",
               &local_a99);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_a98);
    std::__cxx11::string::~string((string *)&local_a98);
    std::allocator<char>::~allocator(&local_a99);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ac0,"Fail, create device with unsupported extension but succeed.",
               &local_ac1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_ac0);
    std::__cxx11::string::~string((string *)&local_ac0);
    std::allocator<char>::~allocator(&local_ac1);
  }
  local_aa0 = 1;
  ::vk::InstanceDriver::~InstanceDriver((InstanceDriver *)local_208);
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::~Unique((Unique<vk::VkInstance_s_*> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createDeviceWithUnsupportedExtensionsTest (Context& context)
{
	tcu::TestLog&					log						= context.getTestContext().getLog();
	const PlatformInterface&		platformInterface		= context.getPlatformInterface();
	const Unique<VkInstance>		instance				(createDefaultInstance(platformInterface));
	const InstanceDriver			instanceDriver			(platformInterface, instance.get());
	const char*						enabledExtensions[]		= {"VK_UNSUPPORTED_EXTENSION", "THIS_IS_NOT_AN_EXTENSION", "VK_DONT_SUPPORT_ME"};
	const VkPhysicalDevice			physicalDevice			= chooseDevice(instanceDriver, instance.get(), context.getTestContext().getCommandLine());
	const float						queuePriority			= 1.0f;
	const VkDeviceQueueCreateInfo	deviceQueueCreateInfo	=
	{
		VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
		DE_NULL,
		(VkDeviceQueueCreateFlags)0u,
		0,										//queueFamilyIndex;
		1,										//queueCount;
		&queuePriority,							//pQueuePriorities;
	};
	const VkDeviceCreateInfo		deviceCreateInfo		=
	{
		VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,	//sType;
		DE_NULL,								//pNext;
		(VkDeviceCreateFlags)0u,
		1,										//queueRecordCount;
		&deviceQueueCreateInfo,					//pRequestedQueues;
		0,										//layerCount;
		DE_NULL,								//ppEnabledLayerNames;
		DE_LENGTH_OF_ARRAY(enabledExtensions),	//extensionCount;
		enabledExtensions,						//ppEnabledExtensionNames;
		DE_NULL,								//pEnabledFeatures;
	};

	log << TestLog::Message << "Enabled extensions are: " << TestLog::EndMessage;

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(enabledExtensions); ndx++)
		log << TestLog::Message << enabledExtensions[ndx] <<  TestLog::EndMessage;

	{
		VkDevice		device		= (VkDevice)0;
		const VkResult	result		= instanceDriver.createDevice(physicalDevice, &deviceCreateInfo, DE_NULL/*pAllocator*/, &device);
		const bool		gotDevice	= !!device;

		if (device)
		{
			const DeviceDriver	deviceIface	(instanceDriver, device);
			deviceIface.destroyDevice(device, DE_NULL/*pAllocator*/);
		}

		if (result == VK_ERROR_EXTENSION_NOT_PRESENT)
		{
			TCU_CHECK(!gotDevice);
			return tcu::TestStatus::pass("Pass, create device with unsupported extension is rejected.");
		}
		else
			return tcu::TestStatus::fail("Fail, create device with unsupported extension but succeed.");
	}
}